

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddErrorCode(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,ValueType *result,ValidateErrorCode code)

{
  StringRefType *pSVar1;
  CrtAllocator *allocator;
  StringRefType local_28;
  
  pSVar1 = GetErrorCodeString();
  local_28.s = pSVar1->s;
  local_28.length = pSVar1->length;
  allocator = this->stateAllocator_;
  if (allocator == (CrtAllocator *)0x0) {
    allocator = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = allocator;
    this->stateAllocator_ = allocator;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  AddMember<rapidjson::ValidateErrorCode>(result,&local_28,code,allocator);
  return;
}

Assistant:

void AddErrorCode(ValueType& result, const ValidateErrorCode code) {
        result.AddMember(GetErrorCodeString(), code, GetStateAllocator());
    }